

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<long>::Visit
          (PrecomputeVisitor<long> *this,shared_ptr<const_calc4::BinaryOperator> *op)

{
  BinaryType BVar1;
  bool bVar2;
  long *dest;
  shared_ptr<const_calc4::Operator> sVar3;
  long result;
  long rightValue;
  long leftValue;
  shared_ptr<const_calc4::Operator> right;
  shared_ptr<const_calc4::Operator> left;
  __shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_40 [16];
  PrecomputeVisitor<long> local_30;
  
  Precompute((PrecomputeVisitor<long> *)&local_30.value,(shared_ptr<const_calc4::Operator> *)this);
  sVar3 = Precompute(&local_30,(shared_ptr<const_calc4::Operator> *)this);
  bVar2 = TryGetPrecomputedValue
                    ((PrecomputeVisitor<long> *)&local_30.value,
                     (shared_ptr<const_calc4::Operator> *)(local_40 + 8),
                     (long *)sVar3.
                             super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._M_pi);
  if (bVar2) {
    bVar2 = TryGetPrecomputedValue(&local_30,(shared_ptr<const_calc4::Operator> *)local_40,dest);
    if (bVar2) {
      BVar1 = ((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->type;
      if (BVar1 == Div) {
        if ((element_type *)local_40._0_8_ != (element_type *)0x0) {
          PrecomputedOperator::Create<long>((long *)&local_50);
          std::__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2> *)&this->value,
                     (__shared_ptr<const_calc4::PrecomputedOperator,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_50);
          goto LAB_0011b49c;
        }
      }
      else if (BVar1 != Mod || (element_type *)local_40._0_8_ != (element_type *)0x0) {
        (*(code *)(&DAT_0012ff24 + *(int *)(&DAT_0012ff24 + (ulong)BVar1 * 4)))
                  ((element_type *)local_40._0_8_ == (element_type *)0x0,&DAT_0012ff24,
                   &DAT_0012ff24 + *(int *)(&DAT_0012ff24 + (ulong)BVar1 * 4));
        return;
      }
    }
  }
  BinaryOperator::Create
            ((shared_ptr<const_calc4::Operator> *)&local_50,&local_30.value,(BinaryType)&local_30);
  std::__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2> *)&this->value,
             &local_50);
LAB_0011b49c:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30.context);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
    {
        std::shared_ptr<const Operator> left = Precompute(op->GetLeft());
        std::shared_ptr<const Operator> right = Precompute(op->GetRight());

        TNumber leftValue, rightValue;
        if (TryGetPrecomputedValue(left, &leftValue) &&
            TryGetPrecomputedValue(right, &rightValue) &&
            !((op->GetType() == BinaryType::Div || op->GetType() == BinaryType::Mod) &&
              rightValue == 0))
        {
            TNumber result;

            switch (op->GetType())
            {
            case BinaryType::Add:
                result = leftValue + rightValue;
                break;
            case BinaryType::Sub:
                result = leftValue - rightValue;
                break;
            case BinaryType::Mult:
                result = leftValue * rightValue;
                break;
            case BinaryType::Div:
                result = leftValue / rightValue;
                break;
            case BinaryType::Mod:
                result = leftValue % rightValue;
                break;
            case BinaryType::Equal:
                result = (leftValue == rightValue) ? 1 : 0;
                break;
            case BinaryType::NotEqual:
                result = (leftValue != rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThan:
                result = (leftValue < rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThanOrEqual:
                result = (leftValue <= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThanOrEqual:
                result = (leftValue >= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThan:
                result = (leftValue > rightValue) ? 1 : 0;
                break;
            default:
                UNREACHABLE();
                break;
            }

            value = PrecomputedOperator::Create(result);
        }
        else
        {
            value = BinaryOperator::Create(left, right, op->GetType());
        }
    }